

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O3

EStatusCode __thiscall
PDFWriter::ContinuePDF
          (PDFWriter *this,string *inOutputFilePath,string *inStateFilePath,
          string *inOptionalModifiedFile,LogConfiguration *inLogConfiguration)

{
  OutputFile *this_00;
  EStatusCode EVar1;
  IByteReaderWithPosition *inSourceStream;
  PDFParsingOptions *inOptions;
  IByteWriterWithPosition *inOutputStream;
  
  SetupLog(this,inLogConfiguration);
  this_00 = &this->mOutputFile;
  EVar1 = OutputFile::OpenFile(this_00,inOutputFilePath,true);
  if (EVar1 == eSuccess) {
    if (inOptionalModifiedFile->_M_string_length == 0) {
LAB_001dcecd:
      inOutputStream = OutputFile::GetOutputStream(this_00);
      ObjectsContext::SetOutputStream(&this->mObjectsContext,inOutputStream);
      PDFHummus::DocumentContext::SetOutputFileInformation(&this->mDocumentContext,this_00);
      EVar1 = SetupState(this,inStateFilePath);
      return EVar1;
    }
    EVar1 = InputFile::OpenFile(&this->mModifiedFile,inOptionalModifiedFile);
    if (EVar1 == eSuccess) {
      inSourceStream = InputFile::GetInputStream(&this->mModifiedFile);
      inOptions = PDFParsingOptions::DefaultPDFParsingOptions();
      EVar1 = PDFParser::StartPDFParsing(&this->mModifiedFileParser,inSourceStream,inOptions);
      if (EVar1 == eSuccess) goto LAB_001dcecd;
    }
  }
  return EVar1;
}

Assistant:

EStatusCode PDFWriter::ContinuePDF(const std::string& inOutputFilePath,
								   const std::string& inStateFilePath,
                                   const std::string& inOptionalModifiedFile,
								   const LogConfiguration& inLogConfiguration)
{


	SetupLog(inLogConfiguration);
	EStatusCode status = mOutputFile.OpenFile(inOutputFilePath,true);
	if(status != eSuccess)
		return status;

    if(inOptionalModifiedFile.size() != 0)
    {
        // setup parser for reading modified file
        status = mModifiedFile.OpenFile(inOptionalModifiedFile);
        if(status != eSuccess)
            return status;

        status = mModifiedFileParser.StartPDFParsing(mModifiedFile.GetInputStream());
        if(status != eSuccess)
            return status;
    }

	mObjectsContext.SetOutputStream(mOutputFile.GetOutputStream());
	mDocumentContext.SetOutputFileInformation(&mOutputFile);

	return SetupState(inStateFilePath);


}